

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O1

void __thiscall solitaire::piles::TableauPile::Snapshot::restore(Snapshot *this)

{
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::operator=
            (&((this->tableauPile).
               super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->cards,&this->pileCards);
  ((this->tableauPile).super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr)->topCoveredCardPosition = this->topCoveredCardPosition;
  return;
}

Assistant:

void TableauPile::Snapshot::restore() const {
    tableauPile->cards = pileCards;
    tableauPile->topCoveredCardPosition = topCoveredCardPosition;
}